

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_ext_test.cpp
# Opt level: O0

void __thiscall
metacall_ext_test_DefaultConstructor_Test::~metacall_ext_test_DefaultConstructor_Test
          (metacall_ext_test_DefaultConstructor_Test *this)

{
  void *in_RDI;
  
  ~metacall_ext_test_DefaultConstructor_Test((metacall_ext_test_DefaultConstructor_Test *)0x10cc38);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_F(metacall_ext_test, DefaultConstructor)
{
	ASSERT_EQ((int)0, (int)metacall_initialize());

	/* Extension */
	const char *ext_scripts[] = {
		"sum_extension" /* The library extension (dll, so, dylib) is crossplatform so we should not add it here */
	};

	void *handle = NULL;

	/* Test reload of the extension */
	EXPECT_EQ((int)0, (int)metacall_load_from_file("ext", ext_scripts, sizeof(ext_scripts) / sizeof(ext_scripts[0]), &handle));

	EXPECT_EQ((int)0, (int)metacall_clear(handle));

	/* Test extension load and call */
	EXPECT_EQ((int)0, (int)metacall_load_from_file("ext", ext_scripts, sizeof(ext_scripts) / sizeof(ext_scripts[0]), NULL));

	void *ret = metacall("sum", 3, 4);

	EXPECT_NE((void *)NULL, (void *)ret);

	EXPECT_EQ((long)metacall_value_to_long(ret), (long)7);

	metacall_value_destroy(ret);

	/* Print inspect information */
	{
		size_t size = 0;

		struct metacall_allocator_std_type std_ctx = { &std::malloc, &std::realloc, &std::free };

		void *allocator = metacall_allocator_create(METACALL_ALLOCATOR_STD, (void *)&std_ctx);

		char *inspect_str = metacall_inspect(&size, allocator);

		EXPECT_NE((char *)NULL, (char *)inspect_str);

		EXPECT_GT((size_t)size, (size_t)0);

		std::cout << inspect_str << std::endl;

		metacall_allocator_free(allocator, inspect_str);

		metacall_allocator_destroy(allocator);
	}

	metacall_destroy();
}